

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bwd.hh
# Opt level: O0

void tchecker::ts::final<tchecker::ta::ta_t>
               (ta_t *bwd_impl,dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels
               ,vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>_>_>
                *v,state_status_t mask)

{
  bool bVar1;
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  *peVar2;
  tuple<tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::system::locs_t::const_iterator_t,_tchecker::system::locs_t::const_iterator_t>_>::values_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t,_tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>::values_iterator_t>_>
  local_3b0;
  final_value_t *local_390;
  final_value_t *final_edge;
  end_iterator_t __end0;
  undefined1 local_378 [8];
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  __begin0;
  final_range_t *__range2;
  final_range_t final_edges;
  state_status_t mask_local;
  vector<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>,_std::allocator<std::tuple<unsigned_int,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::state_t,_unsigned_long,_1UL>_>,_tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::ta::transition_t,_unsigned_long,_1UL>_>_>_>_>
  *v_local;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels_local;
  ta_t *bwd_impl_local;
  
  final_edges._420_4_ = mask;
  ta::ta_t::final_edges((final_range_t *)&__range2,bwd_impl,labels);
  __begin0._valuations_it._its.
  super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&__range2;
  peVar2 = range_t<tchecker::ta::edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>,_tchecker::end_iterator_t>
           ::begin((final_range_t *)&__range2);
  ta::
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::edges_valuations_iterator_t
            ((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
              *)local_378,peVar2);
  range_t<tchecker::ta::edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>,_tchecker::end_iterator_t>
  ::end((range_t<tchecker::ta::edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>,_tchecker::end_iterator_t>
         *)__begin0._valuations_it._its.
           super__Vector_base<tchecker::integer_iterator_t<int>,_std::allocator<tchecker::integer_iterator_t<int>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    bVar1 = ta::
            edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
            ::operator!=((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
                          *)local_378,(end_iterator_t *)((long)&final_edge + 3));
    if (!bVar1) break;
    ta::
    edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
    ::operator*(&local_3b0,
                (edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
                 *)local_378);
    local_390 = &local_3b0;
    ta::ta_t::final(bwd_impl,local_390,v,final_edges._420_4_);
    ta::
    edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
    ::operator++((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
                  *)local_378);
  }
  ta::
  edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
  ::~edges_valuations_iterator_t
            ((edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>
              *)local_378);
  range_t<tchecker::ta::edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>,_tchecker::end_iterator_t>
  ::~range_t((range_t<tchecker::ta::edges_valuations_iterator_t<tchecker::range_t<tchecker::syncprod::final_iterator_t,_tchecker::end_iterator_t>,_tchecker::range_t<tchecker::cartesian_iterator_t<tchecker::range_t<tchecker::integer_iterator_t<int>,_tchecker::integer_iterator_t<int>_>_>,_tchecker::end_iterator_t>_>,_tchecker::end_iterator_t>
              *)&__range2);
  return;
}

Assistant:

void final(BWD_IMPL & bwd_impl, boost::dynamic_bitset<> const & labels, std::vector<typename BWD_IMPL::sst_t> & v,
           tchecker::state_status_t mask)
{
  typename BWD_IMPL::final_range_t final_edges = bwd_impl.final_edges(labels);
  for (typename BWD_IMPL::final_value_t && final_edge : final_edges)
    bwd_impl.final(final_edge, v, mask);
}